

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affinity.cpp
# Opt level: O0

int set_thread_affinity(native_handle_type thread,uint *cpuid)

{
  uint uVar1;
  int iVar2;
  uint *in_RSI;
  pthread_t in_RDI;
  size_t __cpu;
  cpu_set_t cs;
  int rc;
  cpu_set_t local_98;
  undefined4 local_14;
  uint *local_10;
  pthread_t local_8;
  
  local_14 = 0xffffffff;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_98,0,0x80);
  uVar1 = *local_10;
  if (uVar1 >> 3 < 0x80) {
    local_98.__bits[uVar1 >> 6] = 1L << ((byte)uVar1 & 0x3f) | local_98.__bits[uVar1 >> 6];
  }
  iVar2 = pthread_setaffinity_np(local_8,0x80,&local_98);
  return iVar2;
}

Assistant:

int
set_thread_affinity(std::thread::native_handle_type thread,
        const unsigned &cpuid)
{
    int rc = -1;
#ifdef __APPLE__
    thread_port_t mach_thread;
    thread_affinity_policy_data_t policy = { static_cast<integer_t>(cpuid) };
    mach_thread = pthread_mach_thread_np(thread);
    rc = thread_policy_set(mach_thread, THREAD_AFFINITY_POLICY,
            (thread_policy_t)&policy, 1);
#elif defined(_WIN32) || defined(__CYGWIN__)
    rc = SetThreadAffinityMask(reinterpret_cast<HANDLE>(thread), 1ULL << cpuid) == 0 ? -2 : 0;
#elif !defined(__OpenBSD__) && !defined(__FreeBSD__) && !defined(__ANDROID__) && !defined(__NetBSD__)
    cpu_set_t cs;
    CPU_ZERO(&cs);
    CPU_SET(cpuid, &cs);
    rc = pthread_setaffinity_np(thread, sizeof(cpu_set_t), &cs);
#endif
    return rc;
}